

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O0

void cjson_add_true_should_fail_on_allocation_failure(void)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *root;
  
  object = cJSON_CreateObject();
  cJSON_InitHooks(&failing_hooks);
  pcVar1 = cJSON_AddTrueToObject(object,"true");
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x71);
  }
  cJSON_InitHooks((cJSON_Hooks *)0x0);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_true_should_fail_on_allocation_failure(void)
{
    cJSON *root = cJSON_CreateObject();

    cJSON_InitHooks(&failing_hooks);

    TEST_ASSERT_NULL(cJSON_AddTrueToObject(root, "true"));

    cJSON_InitHooks(NULL);

    cJSON_Delete(root);
}